

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

Arg * __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::parse_arg_name
          (Arg *__return_storage_ptr__,BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,Char **s
          )

{
  byte bVar1;
  LongLong LVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  Arg *pAVar6;
  FormatError *this_00;
  byte *pbVar7;
  char *message;
  BasicStringRef<char> local_28;
  
  local_28.data_ = *s;
  if ((*local_28.data_ != 0x5f) && (0x19 < (byte)((*local_28.data_ & 0xdfU) + 0xbf))) {
    __assert_fail("internal::is_name_start(*s)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nuertey[P]spdlog/tests/../include/spdlog/sinks/../fmt/bundled/format.h"
                  ,0x11b1,
                  "internal::Arg fmt::BasicFormatter<char>::parse_arg_name(const Char *&) [CharType = char, ArgFormatter = fmt::ArgFormatter<char>]"
                 );
  }
  local_28.size_ = (long)*s - (long)local_28.data_;
  pbVar7 = (byte *)(*s + 1);
  do {
    do {
      *s = (Char *)pbVar7;
      bVar1 = *pbVar7;
      local_28.size_ = local_28.size_ + 1;
      pbVar7 = pbVar7 + 1;
    } while ((byte)(bVar1 - 0x30) < 10);
  } while ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
  if ((this->super_FormatterBase).next_arg_index_ < 1) {
    (this->super_FormatterBase).next_arg_index_ = -1;
    message = (char *)0x0;
    internal::ArgMap<char>::init(&this->map_,(EVP_PKEY_CTX *)this);
    pAVar6 = internal::ArgMap<char>::find(&this->map_,&local_28);
    if (pAVar6 != (Arg *)0x0) {
      LVar2 = (pAVar6->super_Value).field_0.long_long_value;
      sVar3 = (pAVar6->super_Value).field_0.string.size;
      uVar5 = *(undefined4 *)&pAVar6->field_0x14;
      uVar4 = *(undefined8 *)&pAVar6->field_0x18;
      __return_storage_ptr__->type = pAVar6->type;
      *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar5;
      *(undefined8 *)&__return_storage_ptr__->field_0x18 = uVar4;
      (__return_storage_ptr__->super_Value).field_0.long_long_value = LVar2;
      (__return_storage_ptr__->super_Value).field_0.string.size = sVar3;
      goto LAB_0014fb82;
    }
    message = "argument not found";
  }
  else {
    message = "cannot switch from automatic to manual argument indexing";
  }
  *(undefined8 *)&__return_storage_ptr__->type = 0;
  *(undefined8 *)&__return_storage_ptr__->field_0x18 = 0;
  (__return_storage_ptr__->super_Value).field_0.long_long_value = 0;
  (__return_storage_ptr__->super_Value).field_0.string.size = 0;
LAB_0014fb82:
  if (message != (char *)0x0) {
    this_00 = (FormatError *)__cxa_allocate_exception(0x10);
    FormatError::FormatError(this_00,(CStringRef)message);
    __cxa_throw(this_00,&FormatError::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

inline internal::Arg BasicFormatter<Char, AF>::parse_arg_name(const Char *&s)
{
    assert(internal::is_name_start(*s));
    const Char *start = s;
    Char c;
    do
    {
        c = *++s;
    } while (internal::is_name_start(c) || ('0' <= c && c <= '9'));
    const char *error = FMT_NULL;
    internal::Arg arg = get_arg(BasicStringRef<Char>(start, s - start), error);
    if (error)
        FMT_THROW(FormatError(error));
    return arg;
}